

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

int T_strcmp<char>(char *left,char *right)

{
  char *local_20;
  char *right_local;
  char *left_local;
  
  local_20 = right;
  right_local = left;
  while( true ) {
    if (*right_local != *local_20) {
      return (int)*right_local - (int)*local_20;
    }
    if (*right_local == '\0') break;
    right_local = right_local + 1;
    local_20 = local_20 + 1;
  }
  return 0;
}

Assistant:

static int T_strcmp(const char_T *left, const char_T *right)
{
    for ( ;; ) {
        if (*left != *right)
            return *left - *right;
        if (*left == 0)
            return 0;

        ++left;
        ++right;
    }
}